

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::SubMesh::SubMesh(SubMesh *this)

{
  IndexData *pIVar1;
  
  (this->super_ISubMesh).index = 0;
  (this->super_ISubMesh).name._M_dataplus._M_p = (pointer)&(this->super_ISubMesh).name.field_2;
  (this->super_ISubMesh).name._M_string_length = 0;
  (this->super_ISubMesh).name.field_2._M_local_buf[0] = '\0';
  (this->super_ISubMesh).materialRef._M_dataplus._M_p =
       (pointer)&(this->super_ISubMesh).materialRef.field_2;
  (this->super_ISubMesh).materialRef._M_string_length = 0;
  (this->super_ISubMesh).materialRef.field_2._M_local_buf[0] = '\0';
  (this->super_ISubMesh).textureAliasName._M_dataplus._M_p =
       (pointer)&(this->super_ISubMesh).textureAliasName.field_2;
  (this->super_ISubMesh).textureAliasName._M_string_length = 0;
  (this->super_ISubMesh).textureAliasName.field_2._M_local_buf[0] = '\0';
  (this->super_ISubMesh).textureAliasRef._M_dataplus._M_p =
       (pointer)&(this->super_ISubMesh).textureAliasRef.field_2;
  (this->super_ISubMesh).textureAliasRef._M_string_length = 0;
  (this->super_ISubMesh).textureAliasRef.field_2._M_local_buf[0] = '\0';
  (this->super_ISubMesh).materialIndex = -1;
  (this->super_ISubMesh).usesSharedVertexData = false;
  (this->super_ISubMesh).operationType = OT_POINT_LIST;
  this->vertexData = (VertexData *)0x0;
  pIVar1 = (IndexData *)operator_new(0x20);
  (pIVar1->buffer).super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pIVar1->buffer).super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pIVar1->count = 0;
  pIVar1->faceCount = 0;
  pIVar1->is32bit = false;
  this->indexData = pIVar1;
  return;
}

Assistant:

SubMesh::SubMesh() :
    vertexData(0),
    indexData(new IndexData())
{
}